

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

float Gia_ManPatGetTotalQuo(Gia_Man_t *p,int RareLimit,Vec_Wrd_t *vPatterns,int nWords)

{
  Vec_Wrd_t *pVVar1;
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  float fVar2;
  Vec_Wrd_t *vTemp;
  Vec_Wrd_t *vSims;
  Vec_Int_t *vRareCounts;
  float local_28;
  int n;
  float Total;
  int nWords_local;
  Vec_Wrd_t *vPatterns_local;
  int RareLimit_local;
  Gia_Man_t *p_local;
  
  local_28 = 0.0;
  p_00 = Gia_SimCollectRare(p,vPatterns,RareLimit);
  pVVar1 = p->vSimsPi;
  p->vSimsPi = vPatterns;
  p_01 = Gia_ManSimPatSim(p);
  p->vSimsPi = pVVar1;
  for (vRareCounts._4_4_ = 0; vRareCounts._4_4_ < nWords * 0x40;
      vRareCounts._4_4_ = vRareCounts._4_4_ + 1) {
    fVar2 = Gia_ManPatGetQuo(p,p_00,p_01,vRareCounts._4_4_,nWords);
    local_28 = fVar2 + local_28;
  }
  Vec_IntFree(p_00);
  Vec_WrdFree(p_01);
  return local_28;
}

Assistant:

float Gia_ManPatGetTotalQuo( Gia_Man_t * p, int RareLimit, Vec_Wrd_t * vPatterns, int nWords )
{
    float Total = 0; int n;
    Vec_Int_t * vRareCounts = Gia_SimCollectRare( p, vPatterns, RareLimit );
    Vec_Wrd_t * vSims, * vTemp = p->vSimsPi;
    p->vSimsPi = vPatterns;
    vSims = Gia_ManSimPatSim( p );
    p->vSimsPi = vTemp;
    for ( n = 0; n < 64*nWords; n++ )
        Total += Gia_ManPatGetQuo( p, vRareCounts, vSims, n, nWords );
    Vec_IntFree( vRareCounts );
    Vec_WrdFree( vSims );
    return Total;
}